

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int HSC_Generic(FORM *form,int columns)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (columns < 1) {
    iVar1 = form->begincol;
    iVar2 = -columns;
    if (iVar1 <= -columns) {
      iVar2 = iVar1;
    }
    if (iVar2 < 1) {
      return -0xc;
    }
    form->curcol = form->curcol - iVar2;
    form->begincol = iVar1 - iVar2;
  }
  else {
    iVar1 = form->begincol;
    iVar3 = form->current->dcols - (int)form->current->cols;
    iVar2 = iVar3 - iVar1;
    if (iVar1 + columns <= iVar3) {
      iVar2 = columns;
    }
    if (iVar2 < 1) {
      return -0xc;
    }
    form->curcol = form->curcol + iVar2;
    form->begincol = iVar1 + iVar2;
  }
  return 0;
}

Assistant:

static int HSC_Generic(FORM *form, int columns)
{
  FIELD *field = form->current;
  int res = E_REQUEST_DENIED;
  int cols_to_go = (columns > 0 ? columns : -columns);

  if (columns > 0)
    {
      if ((cols_to_go + form->begincol) > (field->dcols - field->cols))
        cols_to_go = field->dcols - field->cols - form->begincol;
      
      if (cols_to_go > 0)
        {
          form->curcol   += cols_to_go;
          form->begincol += cols_to_go;
          res = E_OK;
        }
    }
  else
    {
      if ( cols_to_go > form->begincol )
        cols_to_go = form->begincol;

      if (cols_to_go > 0)
        {
          form->curcol   -= cols_to_go;
          form->begincol -= cols_to_go;
          res = E_OK;
        }
    }
  return(res);
}